

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snapshot_sync_ctx.cxx
# Opt level: O0

bool __thiscall
nuraft::snapshot_io_mgr::push(snapshot_io_mgr *this,ptr<snapshot_io_mgr::io_queue_elem> *elem)

{
  bool bVar1;
  int32 iVar2;
  int32 iVar3;
  int iVar4;
  uint uVar5;
  element_type *peVar6;
  long in_RDI;
  shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem> *entry;
  iterator __end1;
  iterator __begin1;
  list<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>,_std::allocator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>_>_>
  *__range1;
  logger *l_;
  lock_guard<std::mutex> guard;
  mutex_type *in_stack_ffffffffffffff28;
  element_type *peVar7;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  value_type *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  string local_a0 [36];
  undefined4 local_7c;
  string local_78 [48];
  reference local_48;
  _Self local_40;
  _Self local_38;
  long local_30;
  element_type *local_28;
  byte local_1;
  
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30)
             ,in_stack_ffffffffffffff28);
  std::
  __shared_ptr_access<nuraft::snapshot_io_mgr::io_queue_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<nuraft::snapshot_io_mgr::io_queue_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x237e82);
  peVar6 = std::__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x237e8a);
  local_28 = std::__shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>::get
                       (&(peVar6->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>
                       );
  local_30 = in_RDI + 0x20;
  local_38._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>,_std::allocator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>_>_>
       ::begin((list<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>,_std::allocator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>_>_>
                *)in_stack_ffffffffffffff28);
  local_40._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>,_std::allocator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>_>_>
       ::end((list<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>,_std::allocator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>_>_>
              *)in_stack_ffffffffffffff28);
  do {
    bVar1 = std::operator!=(&local_38,&local_40);
    if (!bVar1) {
      std::__cxx11::
      list<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>,_std::allocator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>_>_>
      ::push_back((list<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>,_std::allocator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>_>_>
                   *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                  in_stack_ffffffffffffff38);
      if ((local_28 != (element_type *)0x0) && (iVar4 = (*local_28->_vptr_logger[7])(), 5 < iVar4))
      {
        peVar7 = local_28;
        std::
        __shared_ptr_access<nuraft::snapshot_io_mgr::io_queue_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<nuraft::snapshot_io_mgr::io_queue_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x238128);
        std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   0x238134);
        uVar5 = peer::get_id((peer *)0x23813c);
        msg_if_given_abi_cxx11_((char *)local_a0,"added snapshot request for peer %d",(ulong)uVar5);
        (*peVar7->_vptr_logger[8])
                  (peVar7,6,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/snapshot_sync_ctx.cxx"
                   ,"push",0x5d,local_a0);
        std::__cxx11::string::~string(local_a0);
      }
      local_1 = 1;
LAB_002381c4:
      local_7c = 1;
      std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x2381d1);
      return (bool)(local_1 & 1);
    }
    local_48 = std::_List_iterator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>_>::
               operator*((_List_iterator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>_> *
                         )0x237f0a);
    std::
    __shared_ptr_access<nuraft::snapshot_io_mgr::io_queue_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<nuraft::snapshot_io_mgr::io_queue_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x237f1f);
    std::
    __shared_ptr_access<nuraft::snapshot_io_mgr::io_queue_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<nuraft::snapshot_io_mgr::io_queue_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x237f31);
    bVar1 = std::operator==((shared_ptr<nuraft::raft_server> *)
                            CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                            (shared_ptr<nuraft::raft_server> *)in_stack_ffffffffffffff28);
    if (bVar1) {
      std::
      __shared_ptr_access<nuraft::snapshot_io_mgr::io_queue_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<nuraft::snapshot_io_mgr::io_queue_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x237f54);
      std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x237f60);
      iVar2 = peer::get_id((peer *)0x237f68);
      std::
      __shared_ptr_access<nuraft::snapshot_io_mgr::io_queue_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<nuraft::snapshot_io_mgr::io_queue_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x237f7b);
      std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x237f87);
      iVar3 = peer::get_id((peer *)0x237f8f);
      if (iVar2 == iVar3) {
        if ((local_28 != (element_type *)0x0) && (iVar4 = (*local_28->_vptr_logger[7])(), 5 < iVar4)
           ) {
          peVar7 = local_28;
          std::
          __shared_ptr_access<nuraft::snapshot_io_mgr::io_queue_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
          ::operator->((__shared_ptr_access<nuraft::snapshot_io_mgr::io_queue_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x237ff2);
          std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                     0x237ffe);
          uVar5 = peer::get_id((peer *)0x238006);
          msg_if_given_abi_cxx11_
                    ((char *)local_78,"snapshot request for peer %d already exists, do nothing",
                     (ulong)uVar5);
          (*peVar7->_vptr_logger[8])
                    (peVar7,6,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/snapshot_sync_ctx.cxx"
                     ,"push",0x58,local_78);
          std::__cxx11::string::~string(local_78);
        }
        local_1 = 0;
        goto LAB_002381c4;
      }
    }
    std::_List_iterator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>_>::operator++
              (&local_38);
  } while( true );
}

Assistant:

bool snapshot_io_mgr::push(ptr<snapshot_io_mgr::io_queue_elem>& elem) {
    auto_lock(queue_lock_);
    logger* l_ = elem->raft_->l_.get();

    // If there is existing one for the same peer, ignore it.
    for (auto& entry: queue_) {
        if ( entry->raft_ == elem->raft_ &&
             entry->dst_->get_id() == elem->dst_->get_id() ) {
            p_tr("snapshot request for peer %d already exists, do nothing",
                 elem->dst_->get_id());
            return false;
        }
    }
    queue_.push_back(elem);
    p_tr("added snapshot request for peer %d", elem->dst_->get_id());

    return true;
}